

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Impl::StdString::EndsWith::toString_abi_cxx11_
          (string *__return_storage_ptr__,EndsWith *this)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"ends with: \"",&(this->m_data).m_str);
  std::operator+(&local_58,&local_38,"\"");
  CasedString::toStringSuffix_abi_cxx11_(&sStack_78,&this->m_data);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string toString() const {
                return "ends with: \"" + m_data.m_str + "\"" + m_data.toStringSuffix();
            }